

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_TeamCityOutputTest_TestNameEscaped_Ignore_Test::testBody
          (TEST_TeamCityOutputTest_TestNameEscaped_Ignore_Test *this)

{
  TestResult *pTVar1;
  UtestShell *pUVar2;
  SimpleString *this_00;
  char *pcVar3;
  TestTerminator *pTVar4;
  char *expected;
  undefined1 local_48 [8];
  IgnoredUtestShell itst;
  TEST_TeamCityOutputTest_TestNameEscaped_Ignore_Test *this_local;
  
  itst.super_UtestShell._48_8_ = this;
  IgnoredUtestShell::IgnoredUtestShell((IgnoredUtestShell *)local_48,"group","\'[]\n\r","file",10);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).result;
  (*pTVar1->_vptr_TestResult[6])(pTVar1,(IgnoredUtestShell *)local_48);
  pUVar2 = UtestShell::getCurrent();
  this_00 = TeamCityOutputToBuffer::getOutput
                      ((this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).mock);
  pcVar3 = SimpleString::asCharString(this_00);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,
             "##teamcity[testStarted name=\'|\'|[|]|n|r\']\n##teamcity[testIgnored name=\'|\'|[|]|n|r\']\n"
             ,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
             ,0xd2,pTVar4);
  IgnoredUtestShell::~IgnoredUtestShell((IgnoredUtestShell *)local_48);
  return;
}

Assistant:

TEST(TeamCityOutputTest, TestNameEscaped_Ignore)
{
	IgnoredUtestShell itst("group", "'[]\n\r", "file", 10);
	result->currentTestStarted(&itst);
	const char* expected =
		"##teamcity[testStarted name='|'|[|]|n|r']\n"
		"##teamcity[testIgnored name='|'|[|]|n|r']\n";
	STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}